

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O0

void write_frame_header(j_compress_ptr cinfo)

{
  bool bVar1;
  int iVar2;
  long *in_RDI;
  j_compress_ptr unaff_retaddr;
  jpeg_component_info *compptr;
  boolean is_baseline;
  int prec;
  int ci;
  JPEG_MARKER in_stack_ffffffffffffffdc;
  j_compress_ptr cinfo_00;
  int local_10;
  int local_c;
  
  local_10 = 0;
  local_c = 0;
  cinfo_00 = (j_compress_ptr)in_RDI[0xd];
  for (; local_c < *(int *)((long)in_RDI + 0x5c); local_c = local_c + 1) {
    iVar2 = emit_dqt(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
    local_10 = iVar2 + local_10;
    cinfo_00 = (j_compress_ptr)&cinfo_00->jpeg_color_space;
  }
  if ((((*(int *)((long)in_RDI + 0x124) == 0) && ((int)in_RDI[0x2b] == 0)) &&
      ((int)in_RDI[0xb] == 8)) && (*(int *)((long)in_RDI + 0x1dc) == 8)) {
    bVar1 = true;
    local_c = 0;
    cinfo_00 = (j_compress_ptr)in_RDI[0xd];
    for (; local_c < *(int *)((long)in_RDI + 0x5c); local_c = local_c + 1) {
      if ((1 < *(int *)((long)&cinfo_00->progress + 4)) || (1 < *(int *)&cinfo_00->client_data)) {
        bVar1 = false;
      }
      cinfo_00 = (j_compress_ptr)&cinfo_00->jpeg_color_space;
    }
    if ((local_10 != 0) && (bVar1)) {
      bVar1 = false;
      *(undefined4 *)(*in_RDI + 0x28) = 0x4d;
      (**(code **)(*in_RDI + 8))(in_RDI,0);
    }
  }
  else {
    bVar1 = false;
  }
  if (*(int *)((long)in_RDI + 0x124) == 0) {
    if ((int)in_RDI[0x2b] == 0) {
      if (bVar1) {
        emit_sof(cinfo_00,in_stack_ffffffffffffffdc);
      }
      else {
        emit_sof(cinfo_00,in_stack_ffffffffffffffdc);
      }
    }
    else {
      emit_sof(cinfo_00,in_stack_ffffffffffffffdc);
    }
  }
  else if ((int)in_RDI[0x2b] == 0) {
    emit_sof(cinfo_00,in_stack_ffffffffffffffdc);
  }
  else {
    emit_sof(cinfo_00,in_stack_ffffffffffffffdc);
  }
  if (((int)in_RDI[0x2b] != 0) && (*(int *)((long)in_RDI + 0x1dc) != 8)) {
    emit_pseudo_sos((j_compress_ptr)0x27124d);
  }
  return;
}

Assistant:

METHODDEF(void)
write_frame_header (j_compress_ptr cinfo)
{
  int ci, prec;
  boolean is_baseline;
  jpeg_component_info *compptr;
  
  /* Emit DQT for each quantization table.
   * Note that emit_dqt() suppresses any duplicate tables.
   */
  prec = 0;
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    prec += emit_dqt(cinfo, compptr->quant_tbl_no);
  }
  /* now prec is nonzero iff there are any 16-bit quant tables. */

  /* Check for a non-baseline specification.
   * Note we assume that Huffman table numbers won't be changed later.
   */
  if (cinfo->arith_code || cinfo->progressive_mode ||
      cinfo->data_precision != 8 || cinfo->block_size != DCTSIZE) {
    is_baseline = FALSE;
  } else {
    is_baseline = TRUE;
    for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
	 ci++, compptr++) {
      if (compptr->dc_tbl_no > 1 || compptr->ac_tbl_no > 1)
	is_baseline = FALSE;
    }
    if (prec && is_baseline) {
      is_baseline = FALSE;
      /* If it's baseline except for quantizer size, warn the user */
      TRACEMS(cinfo, 0, JTRC_16BIT_TABLES);
    }
  }

  /* Emit the proper SOF marker */
  if (cinfo->arith_code) {
    if (cinfo->progressive_mode)
      emit_sof(cinfo, M_SOF10); /* SOF code for progressive arithmetic */
    else
      emit_sof(cinfo, M_SOF9);  /* SOF code for sequential arithmetic */
  } else {
    if (cinfo->progressive_mode)
      emit_sof(cinfo, M_SOF2);	/* SOF code for progressive Huffman */
    else if (is_baseline)
      emit_sof(cinfo, M_SOF0);	/* SOF code for baseline implementation */
    else
      emit_sof(cinfo, M_SOF1);	/* SOF code for non-baseline Huffman file */
  }

  /* Check to emit pseudo SOS marker */
  if (cinfo->progressive_mode && cinfo->block_size != DCTSIZE)
    emit_pseudo_sos(cinfo);
}